

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzbase.cpp
# Opt level: O0

void __thiscall lzham::CLZBase::init_slot_tabs(CLZBase *this)

{
  uint uVar1;
  uint uVar2;
  long in_RDI;
  uint n;
  uint shift;
  uint8 *pTab;
  uint hi;
  uint lo;
  uint i;
  sbyte local_24;
  long local_20;
  uint local_c;
  
  local_c = 0;
  do {
    if (*(uint *)(in_RDI + 8) <= local_c) {
      return;
    }
    uVar2 = *(uint *)(in_RDI + 0xc + (ulong)local_c * 4);
    uVar1 = uVar2 + *(int *)(in_RDI + 0x20c + (ulong)local_c * 4);
    if (uVar1 < 0x1000) {
      local_20 = in_RDI + 0x48c;
      local_24 = 0;
    }
    else if (uVar1 < 0x100000) {
      local_20 = in_RDI + 0x148c;
      local_24 = 0xb;
    }
    else {
      if (0xffffff < uVar1) {
        return;
      }
      local_20 = in_RDI + 0x168c;
      local_24 = 0x10;
    }
    uVar2 = uVar2 >> local_24;
    memset((void *)(local_20 + (ulong)uVar2),local_c & 0xff,
           (ulong)(((uVar1 >> local_24) - uVar2) + 1));
    local_c = local_c + 1;
  } while( true );
}

Assistant:

void CLZBase::init_slot_tabs()
   {
      for (uint i = 0; i < m_num_lzx_slots; i++)
      {
         //printf("%u: 0x%08X - 0x%08X, %u\n", i, m_lzx_position_base[i], m_lzx_position_base[i] + (1 << m_lzx_position_extra_bits[i]) - 1, m_lzx_position_extra_bits[i]);

         uint lo = m_lzx_position_base[i];
         uint hi = lo + m_lzx_position_extra_mask[i];

         uint8* pTab;
         uint shift;
         uint n;

         if (hi < 0x1000)
         {
            pTab = m_slot_tab0;
            shift = 0;
            n = sizeof(m_slot_tab0);
         }
         else if (hi < 0x100000)
         {
            pTab = m_slot_tab1;
            shift = 11;
            n = sizeof(m_slot_tab1);
         }
         else if (hi < 0x1000000)
         {
            pTab = m_slot_tab2;
            shift = 16;
            n = sizeof(m_slot_tab2);
         }
         else
            break;

         lo >>= shift;
         hi >>= shift;

         LZHAM_ASSERT(hi < n);
         memset(pTab + lo, (uint8)i, hi - lo + 1);
      }

#ifdef LZHAM_BUILD_DEBUG      
      uint slot, ofs;
      for (uint i = 1; i < m_num_lzx_slots; i++) 
      {
         compute_lzx_position_slot(m_lzx_position_base[i], slot, ofs);
         LZHAM_ASSERT(slot == i);

         compute_lzx_position_slot(m_lzx_position_base[i] + m_lzx_position_extra_mask[i], slot, ofs);
         LZHAM_ASSERT(slot == i);
      }

      for (uint i = 1; i <= (m_dict_size-1); i += 512U*1024U)
      {
         compute_lzx_position_slot(i, slot, ofs);
         LZHAM_ASSERT(i == m_lzx_position_base[slot] + ofs);
      }

      compute_lzx_position_slot(m_dict_size - 1, slot, ofs);
      LZHAM_ASSERT((m_dict_size - 1) == m_lzx_position_base[slot] + ofs);
#endif      
   }